

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void processOptionsInternal
               (cmGeneratorTarget *tgt,
               vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
               *entries,vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *options,
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *uniqueOptions,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
               bool debugOptions,char *logName,string *language,OptionsParse parse)

{
  pointer pBVar1;
  undefined8 uVar2;
  pointer pbVar3;
  int iVar4;
  string *arg;
  long *plVar5;
  cmake *this;
  undefined8 *puVar6;
  ulong *puVar7;
  long *plVar8;
  string *o;
  cmGeneratorExpressionDAGChecker *pcVar9;
  element_type *peVar10;
  pointer __args;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar11;
  undefined7 in_stack_00000009;
  undefined4 in_stack_00000024;
  int in_stack_00000028;
  string usedOptions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entryOptions;
  __hashtable *__h;
  undefined1 local_188 [32];
  undefined1 local_168 [16];
  element_type local_158;
  element_type **local_100;
  long local_f8;
  element_type *local_f0 [2];
  undefined1 *local_e0;
  long local_d8;
  undefined1 local_d0;
  undefined7 uStack_cf;
  vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *local_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  long *local_80 [2];
  long local_70 [2];
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_60;
  string *local_58;
  pointer *local_50;
  cmGeneratorExpressionDAGChecker *local_48;
  cmListFileBacktrace local_40;
  
  local_158.field_0._48_8_ = tgt;
  local_c0 = (vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
             uniqueOptions;
  local_60 = options;
  local_58 = config;
  local_48 = dagChecker;
  if ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)entries != options) {
    do {
      pBVar1 = *(pointer *)entries;
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_50 = (pointer *)entries;
      arg = (string *)
            (**(code **)((pBVar1->Value)._M_dataplus._M_p + 0x18))
                      (pBVar1,*(cmLocalGenerator **)(local_158.field_0._48_8_ + 0x10),
                       CONCAT71(in_stack_00000009,debugOptions),0,local_158.field_0._48_8_,local_58,
                       CONCAT44(in_stack_00000024,parse));
      cmSystemTools::ExpandListArgument(arg,&local_98,false);
      pbVar3 = local_98.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_e0 = &local_d0;
      local_d8 = 0;
      local_d0 = 0;
      __args = local_98.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_98.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_98.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          local_188._0_8_ = local_48;
          pVar11 = std::
                   _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                   ::
                   _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                             ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                               *)local_48,__args,local_188);
          if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            if ((in_stack_00000028 == 1) &&
               (iVar4 = strncmp((__args->_M_dataplus)._M_p,"SHELL:",6), iVar4 == 0)) {
              local_188._0_8_ = (cmGeneratorExpressionDAGChecker *)0x0;
              local_188._8_8_ = (cmGeneratorExpressionDAGChecker *)0x0;
              local_188._16_8_ = (pointer)0x0;
              cmSystemTools::ParseUnixCommandLine
                        ((__args->_M_dataplus)._M_p + 6,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_188);
              uVar2 = local_188._8_8_;
              for (pcVar9 = (cmGeneratorExpressionDAGChecker *)local_188._0_8_;
                  pcVar9 != (cmGeneratorExpressionDAGChecker *)uVar2;
                  pcVar9 = (cmGeneratorExpressionDAGChecker *)
                           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)&pcVar9->Property + 1)) {
                (**(code **)((pBVar1->Value)._M_dataplus._M_p + 0x20))
                          ((cmListFileBacktrace *)local_168,pBVar1);
                std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                emplace_back<std::__cxx11::string,cmListFileBacktrace>
                          (local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)pcVar9,(cmListFileBacktrace *)local_168);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
                }
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_188);
            }
            else {
              (**(code **)((pBVar1->Value)._M_dataplus._M_p + 0x20))
                        ((cmListFileBacktrace *)local_188,pBVar1);
              std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
              emplace_back<std::__cxx11::string_const&,cmListFileBacktrace>
                        (local_c0,__args,(cmListFileBacktrace *)local_188);
              if ((cmGeneratorExpressionDAGChecker *)local_188._8_8_ !=
                  (cmGeneratorExpressionDAGChecker *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
              }
            }
            if ((char)logName != '\0') {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_168," * ",__args);
              plVar5 = (long *)std::__cxx11::string::append((char *)local_168);
              local_188._0_8_ = local_188 + 0x10;
              pcVar9 = (cmGeneratorExpressionDAGChecker *)(plVar5 + 2);
              if ((cmGeneratorExpressionDAGChecker *)*plVar5 == pcVar9) {
                local_188._16_8_ = ((_Alloc_hider *)&pcVar9->Parent)->_M_p;
                local_188._24_8_ = plVar5[3];
              }
              else {
                local_188._16_8_ = ((_Alloc_hider *)&pcVar9->Parent)->_M_p;
                local_188._0_8_ = (cmGeneratorExpressionDAGChecker *)*plVar5;
              }
              local_188._8_8_ = plVar5[1];
              *plVar5 = (long)pcVar9;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&local_e0,local_188._0_8_);
              if ((cmGeneratorExpressionDAGChecker *)local_188._0_8_ !=
                  (cmGeneratorExpressionDAGChecker *)(local_188 + 0x10)) {
                operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
              }
              if ((element_type *)local_168._0_8_ != &local_158) {
                operator_delete((void *)local_168._0_8_,
                                (ulong)&((local_158.field_0.Bottom.State)->PropertyDefinitions)._M_t
                                        ._M_impl.field_0x1);
              }
            }
          }
          __args = __args + 1;
        } while (__args != pbVar3);
        if (local_d8 != 0) {
          this = cmLocalGenerator::GetCMakeInstance
                           (*(cmLocalGenerator **)(local_158.field_0._48_8_ + 0x10));
          local_80[0] = local_70;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"Used ","");
          plVar5 = (long *)std::__cxx11::string::append((char *)local_80);
          local_158.field_0._56_8_ = &local_158.Parent;
          puVar7 = (ulong *)(plVar5 + 2);
          if ((shared_ptr<const_cmListFileBacktrace::Entry> *)*plVar5 ==
              (shared_ptr<const_cmListFileBacktrace::Entry> *)puVar7) {
            local_158.Parent.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 = (element_type *)*puVar7;
            local_158.Parent.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._0_4_ = (undefined4)plVar5[3];
            local_158.Parent.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._4_4_ = *(undefined4 *)((long)plVar5 + 0x1c);
          }
          else {
            local_158.Parent.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 = (element_type *)*puVar7;
            local_158.field_0._56_8_ = (shared_ptr<const_cmListFileBacktrace::Entry> *)*plVar5;
          }
          local_158.field_0.Context.Line = plVar5[1];
          *plVar5 = (long)puVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          local_100 = local_f0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_100," for target ","");
          peVar10 = (element_type *)0xf;
          if ((shared_ptr<const_cmListFileBacktrace::Entry> *)local_158.field_0._56_8_ !=
              &local_158.Parent) {
            peVar10 = local_158.Parent.
                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
          }
          if (peVar10 < (element_type *)(local_f8 + local_158.field_0.Context.Line)) {
            peVar10 = (element_type *)0xf;
            if (local_100 != local_f0) {
              peVar10 = local_f0[0];
            }
            if (peVar10 < (element_type *)(local_f8 + local_158.field_0.Context.Line))
            goto LAB_002f7b38;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_100,0,(char *)0x0,local_158.field_0._56_8_);
          }
          else {
LAB_002f7b38:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)((long)&local_158.field_0 + 0x38),(ulong)local_100);
          }
          local_158.field_0.Bottom.Position.Position = (long)&local_158.field_0 + 0x20;
          plVar5 = puVar6 + 2;
          if ((long *)*puVar6 == plVar5) {
            local_158.field_0.Context.FilePath._M_dataplus._M_p = (_Alloc_hider)*plVar5;
            local_158.field_0.Context.FilePath._M_string_length = puVar6[3];
          }
          else {
            local_158.field_0.Context.FilePath._M_dataplus._M_p = (_Alloc_hider)*plVar5;
            local_158.field_0.Bottom.Position.Position = (PositionType)(long *)*puVar6;
          }
          local_158.field_0._24_8_ = puVar6[1];
          *puVar6 = plVar5;
          puVar6[1] = 0;
          *(undefined1 *)plVar5 = 0;
          plVar5 = (long *)std::__cxx11::string::_M_append
                                     ((char *)((long)&local_158.field_0 + 0x10),
                                      *(ulong *)(*(long *)local_158.field_0._48_8_ + 0xc0));
          local_b8 = &local_a8;
          plVar8 = plVar5 + 2;
          if ((long *)*plVar5 == plVar8) {
            local_a8 = *plVar8;
            lStack_a0 = plVar5[3];
          }
          else {
            local_a8 = *plVar8;
            local_b8 = (long *)*plVar5;
          }
          local_b0 = plVar5[1];
          *plVar5 = (long)plVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_b8);
          peVar10 = (element_type *)(plVar5 + 2);
          if ((element_type *)*plVar5 == peVar10) {
            local_158.field_0.Bottom.State = (peVar10->field_0).Bottom.State;
            local_158.field_0.Bottom.Position.Tree =
                 (cmLinkedTree<cmStateDetail::SnapshotDataType> *)plVar5[3];
            local_168._0_8_ = &local_158;
          }
          else {
            local_158.field_0.Bottom.State = (peVar10->field_0).Bottom.State;
            local_168._0_8_ = (element_type *)*plVar5;
          }
          local_168._8_8_ = plVar5[1];
          *plVar5 = (long)peVar10;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::_M_append(local_168,(ulong)local_e0);
          local_188._0_8_ = local_188 + 0x10;
          pcVar9 = (cmGeneratorExpressionDAGChecker *)(plVar5 + 2);
          if ((cmGeneratorExpressionDAGChecker *)*plVar5 == pcVar9) {
            local_188._16_8_ = ((_Alloc_hider *)&pcVar9->Parent)->_M_p;
            local_188._24_8_ = plVar5[3];
          }
          else {
            local_188._16_8_ = ((_Alloc_hider *)&pcVar9->Parent)->_M_p;
            local_188._0_8_ = (cmGeneratorExpressionDAGChecker *)*plVar5;
          }
          local_188._8_8_ = plVar5[1];
          *plVar5 = (long)pcVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          (**(code **)((pBVar1->Value)._M_dataplus._M_p + 0x20))(&local_40,pBVar1);
          cmake::IssueMessage(this,LOG,(string *)local_188,&local_40);
          if (local_40.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_40.TopEntry.
                       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if ((cmGeneratorExpressionDAGChecker *)local_188._0_8_ !=
              (cmGeneratorExpressionDAGChecker *)(local_188 + 0x10)) {
            operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
          }
          if ((element_type *)local_168._0_8_ != &local_158) {
            operator_delete((void *)local_168._0_8_,
                            (ulong)&((local_158.field_0.Bottom.State)->PropertyDefinitions)._M_t.
                                    _M_impl.field_0x1);
          }
          if (local_b8 != &local_a8) {
            operator_delete(local_b8,local_a8 + 1);
          }
          if ((long *)local_158.field_0.Bottom.Position.Position !=
              (long *)((long)&local_158.field_0 + 0x20)) {
            operator_delete((void *)local_158.field_0.Bottom.Position.Position,
                            (ulong)((long)local_158.field_0.Context.FilePath._M_dataplus._M_p + 1));
          }
          if (local_100 != local_f0) {
            operator_delete(local_100,(ulong)((long)&local_f0[0]->field_0 + 1));
          }
          if ((shared_ptr<const_cmListFileBacktrace::Entry> *)local_158.field_0._56_8_ !=
              &local_158.Parent) {
            operator_delete((void *)local_158.field_0._56_8_,
                            (ulong)((long)&(local_158.Parent.
                                            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->field_0 + 1));
          }
          if (local_80[0] != local_70) {
            operator_delete(local_80[0],local_70[0] + 1);
          }
        }
      }
      if (local_e0 != &local_d0) {
        operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_98);
      entries = (vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                 *)(local_50 + 1);
    } while ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)entries != local_60);
  }
  return;
}

Assistant:

static void processOptionsInternal(
  cmGeneratorTarget const* tgt,
  const std::vector<cmGeneratorTarget::TargetPropertyEntry*>& entries,
  std::vector<BT<std::string>>& options,
  std::unordered_set<std::string>& uniqueOptions,
  cmGeneratorExpressionDAGChecker* dagChecker, const std::string& config,
  bool debugOptions, const char* logName, std::string const& language,
  OptionsParse parse)
{
  for (cmGeneratorTarget::TargetPropertyEntry* entry : entries) {
    std::vector<std::string> entryOptions;
    cmSystemTools::ExpandListArgument(entry->Evaluate(tgt->GetLocalGenerator(),
                                                      config, false, tgt,
                                                      dagChecker, language),
                                      entryOptions);
    std::string usedOptions;
    for (std::string const& opt : entryOptions) {
      if (uniqueOptions.insert(opt).second) {
        if (parse == OptionsParse::Shell &&
            cmHasLiteralPrefix(opt, "SHELL:")) {
          std::vector<std::string> tmp;
          cmSystemTools::ParseUnixCommandLine(opt.c_str() + 6, tmp);
          for (std::string& o : tmp) {
            options.emplace_back(std::move(o), entry->GetBacktrace());
          }
        } else {
          options.emplace_back(opt, entry->GetBacktrace());
        }
        if (debugOptions) {
          usedOptions += " * " + opt + "\n";
        }
      }
    }
    if (!usedOptions.empty()) {
      tgt->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::LOG,
        std::string("Used ") + logName + std::string(" for target ") +
          tgt->GetName() + ":\n" + usedOptions,
        entry->GetBacktrace());
    }
  }
}